

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromArray(MessageLite *this,void *data,int size)

{
  MessageFactory *pMVar1;
  uint uVar2;
  bool local_b2;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  undefined1 local_80 [8];
  CodedInputStream input;
  
  input.extension_factory_ = (MessageFactory *)this;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_80,(uint8 *)data,size);
  pMVar1 = input.extension_factory_;
  (*(input.extension_factory_)->_vptr_MessageFactory[7])();
  uVar2 = (*pMVar1->_vptr_MessageFactory[0xb])(pMVar1,(CodedInputStream *)local_80);
  local_b2 = false;
  if ((uVar2 & 1) != 0) {
    local_b2 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_80);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_80);
  return local_b2;
}

Assistant:

bool MessageLite::ParsePartialFromArray(const void* data, int size) {
  return InlineParsePartialFromArray(data, size, this);
}